

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_exporttype_t * wasm_exporttype_new(wasm_name_t *name,wasm_externtype_t *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wasm_exporttype_t *this;
  pointer *__ptr;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_78;
  ExportType local_70;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  this = (wasm_exporttype_t *)operator_new(0x40);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,name->data,name->data + name->size);
  (*((type->I)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_78);
  paVar1 = &local_70.name.field_2;
  local_70.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_48,local_48 + local_40);
  local_70.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )local_78._M_head_impl;
  local_78._M_head_impl = (ExternType *)0x0;
  wasm_exporttype_t::wasm_exporttype_t(this,&local_70);
  if ((_Head_base<0UL,_wabt::interp::ExternType_*,_false>)
      local_70.type._M_t.
      super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
      .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_70.type._M_t.
        super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
        .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)[1])();
  }
  local_70.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>)
         0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  if (local_78._M_head_impl != (ExternType *)0x0) {
    (*(local_78._M_head_impl)->_vptr_ExternType[1])();
  }
  local_78._M_head_impl = (ExternType *)0x0;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return this;
}

Assistant:

own wasm_exporttype_t* wasm_exporttype_new(own wasm_name_t* name,
                                           wasm_externtype_t* type) {
  return new wasm_exporttype_t{ExportType{ToString(name), type->I->Clone()}};
}